

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

void __thiscall cpsm::Error::~Error(Error *this)

{
  *(undefined ***)this = &PTR__Error_00128ca0;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

Error() : msg_("(unknown error)") {}